

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_phi_fixup(ASMState *as)

{
  IRIns *pIVar1;
  uint uVar2;
  uint uVar3;
  IRIns *ir;
  IRRef lref;
  Reg r;
  RegSet work;
  ASMState *as_local;
  
  for (lref = as->phiset; lref != 0; lref = (1 << ((byte)uVar3 & 0x1f) ^ 0xffffffffU) & lref) {
    uVar2 = lref >> 0x18 | (lref & 0xff0000) >> 8 | (lref & 0xff00) << 8 | lref << 0x18;
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x18;
    uVar2 = (uint)as->phireg[uVar3];
    pIVar1 = as->ir;
    if ((((&pIVar1->field_1)[uVar2].t.irt & 0x20) != 0) &&
       ((&pIVar1->field_1)[uVar2].t.irt = (&pIVar1->field_1)[uVar2].t.irt & 0xdf,
       (&pIVar1->field_1)[uVar2].s != '\0')) {
      ra_addrename(as,uVar3,uVar2,as->loopsnapno);
    }
  }
  return;
}

Assistant:

static void asm_phi_fixup(ASMState *as)
{
  RegSet work = as->phiset;
  while (work) {
    Reg r = rset_picktop(work);
    IRRef lref = as->phireg[r];
    IRIns *ir = IR(lref);
    if (irt_ismarked(ir->t)) {
      irt_clearmark(ir->t);
      /* Left PHI gained a spill slot before the loop? */
      if (ra_hasspill(ir->s)) {
	ra_addrename(as, r, lref, as->loopsnapno);
      }
    }
    rset_clear(work, r);
  }
}